

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O3

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
SwapFallback<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
          (RepeatedPtrFieldBase *this,RepeatedPtrFieldBase *other)

{
  void *pvVar1;
  _Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
  _Var2;
  RepeatedPtrFieldBase temp;
  undefined1 local_38 [8];
  _Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false> _Stack_30;
  Arena *local_28;
  LogMessageFatal local_20;
  
  local_28 = other->arena_;
  if (this->arena_ == local_28) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x226,"!internal::CanUseInternalSwap(GetArena(), other->GetArena())");
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_38)
    ;
  }
  local_38 = (undefined1  [8])0x0;
  _Stack_30._M_head_impl = (LogMessageData *)0x0;
  if (this->current_size_ != 0) {
    MergeFrom<google::protobuf::MessageLite>((RepeatedPtrFieldBase *)local_38,this);
  }
  CopyFrom<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>(this,other);
  if ((RepeatedPtrFieldBase *)local_38 != other) {
    pvVar1 = other->tagged_rep_or_elem_;
    _Var2.
    super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>.
    _M_head_impl = *(_Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                     *)&other->current_size_;
    other->tagged_rep_or_elem_ = (void *)local_38;
    *(LogMessageData **)&other->current_size_ = _Stack_30._M_head_impl;
    local_38 = (undefined1  [8])pvVar1;
    _Stack_30 = _Var2.
                super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                ._M_head_impl;
    if (pvVar1 != (void *)0x0) {
      Destroy<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                ((RepeatedPtrFieldBase *)local_38);
    }
    ~RepeatedPtrFieldBase((RepeatedPtrFieldBase *)local_38);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field.h"
             ,0x145,"this != rhs");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
}

Assistant:

inline Arena* GetArena() const { return arena_; }